

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

void processCommand(LinkerScriptCommand command,uint16_t arg,uint16_t *pc)

{
  code *pcVar1;
  ushort uVar2;
  uint16_t mask;
  uint16_t *pc_local;
  uint16_t arg_local;
  LinkerScriptCommand command_local;
  
  pc_local._2_2_ = arg;
  switch(command) {
  case COMMAND_ORG:
    break;
  case COMMAND_ALIGN:
    if (arg < 0x10) {
      uVar2 = (short)(1 << ((byte)arg & 0x1f)) - 1;
      pc_local._2_2_ = *pc + uVar2 & (uVar2 ^ 0xffff);
    }
    else {
      pc_local._2_2_ = 0;
    }
    break;
  case COMMAND_DS:
    pc_local._2_2_ = arg + *pc;
    break;
  case COMMAND_INVALID:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (*pc <= pc_local._2_2_) {
    *pc = pc_local._2_2_;
    return;
  }
  errx("%s(%u): `%s` cannot be used to go backwards (currently at $%x)",linkerScriptName,
       (ulong)lineNo,commands[command],(ulong)*pc);
}

Assistant:

static void processCommand(enum LinkerScriptCommand command, uint16_t arg, uint16_t *pc)
{
	switch (command) {
	case COMMAND_INVALID:
		unreachable_();

	case COMMAND_ORG:
		break;

	case COMMAND_ALIGN:
		if (arg >= 16) {
			arg = 0;
		} else {
			uint16_t mask = (1 << arg) - 1;

			arg = (*pc + mask) & ~mask;
		}
		break;

	case COMMAND_DS:
		arg += *pc;
	}

	if (arg < *pc)
		errx("%s(%" PRIu32 "): `%s` cannot be used to go backwards (currently at $%x)",
		     linkerScriptName, lineNo, commands[command], *pc);
	*pc = arg;
}